

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O2

void __thiscall cmQtAutoGeneratorRcc::SettingsFileWrite(cmQtAutoGeneratorRcc *this)

{
  Logger *this_00;
  FileSystem *this_01;
  string *filename;
  bool bVar1;
  allocator<char> local_61;
  string content;
  string local_40;
  
  if (this->SettingsChanged_ == true) {
    this_00 = &(this->super_cmQtAutoGenerator).Logger_;
    if ((this->super_cmQtAutoGenerator).Logger_.Verbosity_ != 0) {
      cmQtAutoGen::Quoted(&local_40,&this->SettingsFile_);
      std::operator+(&content,"Writing settings file ",&local_40);
      cmQtAutoGenerator::Logger::Info(this_00,RCC,&content);
      std::__cxx11::string::~string((string *)&content);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&content,"rcc:",(allocator<char> *)&local_40);
    std::__cxx11::string::append((string *)&content);
    std::__cxx11::string::push_back((char)&content);
    this_01 = &(this->super_cmQtAutoGenerator).FileSys_;
    filename = &this->SettingsFile_;
    bVar1 = cmQtAutoGenerator::FileSystem::FileWrite(this_01,RCC,filename,&content);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Settings file writing failed",&local_61);
      cmQtAutoGenerator::Logger::ErrorFile(this_00,RCC,filename,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      cmQtAutoGenerator::FileSystem::FileRemove(this_01,filename);
      this->Error_ = true;
    }
    std::__cxx11::string::~string((string *)&content);
  }
  cmFileLock::Release(&this->LockFileLock_);
  return;
}

Assistant:

void cmQtAutoGeneratorRcc::SettingsFileWrite()
{
  // Only write if any setting changed
  if (SettingsChanged_) {
    if (Log().Verbose()) {
      Log().Info(GenT::RCC, "Writing settings file " + Quoted(SettingsFile_));
    }
    // Write settings file
    std::string content = "rcc:";
    content += SettingsString_;
    content += '\n';
    if (!FileSys().FileWrite(GenT::RCC, SettingsFile_, content)) {
      Log().ErrorFile(GenT::RCC, SettingsFile_,
                      "Settings file writing failed");
      // Remove old settings file to trigger a full rebuild on the next run
      FileSys().FileRemove(SettingsFile_);
      Error_ = true;
    }
  }

  // Unlock the lock file
  LockFileLock_.Release();
}